

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethod
          (ConversionStream *this,iterator *Token,iterator *ScopeStart,iterator *ScopeEnd)

{
  size_type *psVar1;
  _List_node_base *p_Var2;
  HLSL2GLSLConverterImpl *this_00;
  int iVar3;
  uint uVar4;
  Uint32 _NumArgs;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos;
  _List_node_base *p_Var5;
  HLSLObjectInfo *_Obj;
  const_iterator cVar6;
  iterator iVar7;
  iterator *piVar8;
  TokenListType *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_7;
  allocator local_1d9;
  string msg;
  String local_178;
  _List_node_base *local_158;
  Uint32 NumArguments;
  _List_node_base *local_148;
  iterator *local_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  undefined1 *local_f8;
  size_type local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined1 *local_d8;
  size_type local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined1 *local_b8;
  size_type local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 *local_78;
  size_type local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  iterator ArgsListEndToken;
  
  Pos._M_node = Token->_M_node;
  piVar8 = ScopeEnd;
  if ((ScopeEnd->_M_node == Pos._M_node) ||
     (iVar3 = std::__cxx11::string::compare((char *)&Pos._M_node[1]._M_prev), iVar3 != 0)) {
    FormatString<char[26],char[46]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DotToken != ScopeEnd && Token->Literal == \".\"",
               (char (*) [46])piVar8);
    piVar8 = (iterator *)0x6b6;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessObjectMethod",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6b6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var2 = (Pos._M_node)->_M_next;
  if ((p_Var2 == ScopeEnd->_M_node) || (*(int *)&p_Var2[1]._M_next != 0x13b)) {
    FormatString<char[26],char[70]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "MethodToken != ScopeEnd && MethodToken->Type == TokenType::Identifier",
               (char (*) [70])piVar8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessObjectMethod",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6b9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var5 = ScopeStart->_M_node;
  if (p_Var5 != Pos._M_node) {
    local_148 = Pos._M_node;
    local_140 = Token;
    if (*(int *)&Pos._M_node[1]._M_next != 0x13b) {
      do {
        Pos._M_node = (Pos._M_node)->_M_prev;
        uVar4 = *(int *)&Pos._M_node[1]._M_next - 0x136;
        if (((uVar4 < 5) && ((0x15U >> (uVar4 & 0x1f) & 1) != 0)) &&
           (Pos = Parsing::
                  FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                            (ScopeStart,ScopeEnd,Pos), Token->_M_node == ScopeEnd->_M_node)) {
          FormatString<char[45]>(&msg,(char (*) [45])"Unable to find matching open square bracket.")
          ;
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_178,this,Token,4);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessObjectMethod",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x6ca,&msg,(char (*) [2])0x341003,&local_178);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var5 = ScopeStart->_M_node;
        if (Pos._M_node == p_Var5) {
          return false;
        }
      } while (*(int *)&Pos._M_node[1]._M_next != 0x13b);
    }
    if (Pos._M_node != p_Var5) {
      _Obj = FindHLSLObject(this,(String *)&Pos._M_node[1]._M_prev);
      if (((_Obj != (HLSLObjectInfo *)0x0) &&
          (local_158 = p_Var2->_M_next, local_158 != ScopeEnd->_M_node)) &&
         ((*(int *)&local_158[1]._M_next == 0x135 &&
          (ArgsListEndToken._M_node = local_158,
          _NumArgs = CountFunctionArguments(this,&ArgsListEndToken,ScopeEnd),
          ArgsListEndToken._M_node != ScopeEnd->_M_node)))) {
        this_00 = this->m_Converter;
        NumArguments = _NumArgs;
        std::__cxx11::string::string((string *)&local_178,(char *)p_Var2[1]._M_prev,&local_1d9);
        FunctionStubHashKey::FunctionStubHashKey
                  ((FunctionStubHashKey *)&msg,&_Obj->GLSLType,&local_178,_NumArgs);
        Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f0eff;
        cVar6 = std::
                _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this_00,(key_type *)&msg);
        if ((msg.field_2._M_allocated_capacity != 0) && ((long)msg.field_2._8_8_ < 0)) {
          Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f0f19;
          operator_delete__((void *)msg.field_2._M_allocated_capacity);
        }
        msg.field_2._M_allocated_capacity = 0;
        msg.field_2._8_8_ = 0;
        if ((msg._M_dataplus._M_p != (pointer)0x0) && ((long)msg._M_string_length < 0)) {
          Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f0f3b;
          operator_delete__(msg._M_dataplus._M_p);
        }
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f0f65;
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if (cVar6.
            super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
            ._M_cur != (__node_type *)0x0) {
          local_d8 = &local_c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,",","");
          local_58 = &local_48;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
          psVar1 = &msg.field_2._M_allocated_capacity + 1;
          msg._M_dataplus._M_p._0_4_ = 0x13f;
          msg._M_string_length = (size_type)psVar1;
          if (local_d8 != &local_c8) {
            msg._M_string_length = (size_type)local_d8;
          }
          msg.field_2._M_allocated_capacity = local_d0;
          local_d0 = 0;
          local_c8 = 0;
          local_50 = 0;
          local_48 = 0;
          local_d8 = &local_c8;
          local_58 = &local_48;
          Parsing::HLSLTokenInfo::operator=((HLSLTokenInfo *)(local_158 + 1),(HLSLTokenInfo *)&msg);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
          if (local_58 != &local_48) {
            operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
          }
          p_Var2 = local_158;
          this_01 = &this->m_Tokens;
          iVar7._M_node = local_148;
          while (p_Var2 != iVar7._M_node) {
            p_Var5 = (iVar7._M_node)->_M_next;
            std::__cxx11::
            list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            ::_M_erase(this_01,iVar7);
            iVar7._M_node = p_Var5;
          }
          std::__cxx11::string::string
                    ((string *)&local_78,
                     *(char **)((long)cVar6.
                                      super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                                      ._M_cur + 0x30),(allocator *)&local_178);
          std::__cxx11::string::string
                    ((string *)&local_98,(char *)Pos._M_node[3]._M_prev,&local_1d9);
          msg._M_dataplus._M_p._0_4_ = 0x13b;
          msg._M_string_length = (size_type)psVar1;
          if (local_78 != &local_68) {
            msg._M_string_length = (size_type)local_78;
          }
          msg.field_2._M_allocated_capacity = local_70;
          local_70 = 0;
          local_68 = 0;
          local_90 = 0;
          local_88 = 0;
          local_98 = &local_88;
          local_78 = &local_68;
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>
                    (this_01,(const_iterator)Pos._M_node,(HLSLTokenInfo *)&msg);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
          if (local_98 != &local_88) {
            operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
          }
          if (local_78 != &local_68) {
            operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
          }
          std::__cxx11::string::operator=((string *)&Pos._M_node[3]._M_prev," ");
          local_f8 = &local_e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"(","");
          local_118 = &local_108;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
          msg._M_dataplus._M_p._0_4_ = 0x135;
          msg._M_string_length = (size_type)psVar1;
          if (local_f8 != &local_e8) {
            msg._M_string_length = (size_type)local_f8;
          }
          msg.field_2._M_allocated_capacity = local_f0;
          local_f0 = 0;
          local_e8 = 0;
          local_110 = 0;
          local_108 = 0;
          local_118 = &local_108;
          local_f8 = &local_e8;
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>
                    (this_01,(const_iterator)Pos._M_node,(HLSLTokenInfo *)&msg);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
          piVar8 = local_140;
          if (local_118 != &local_108) {
            operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
          }
          iVar7._M_node = ArgsListEndToken._M_node;
          piVar8->_M_node = local_158;
          if (*(long *)((long)cVar6.
                              super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                              ._M_cur + 0x58) != 0) {
            std::__cxx11::string::string
                      ((string *)&local_b8,
                       *(char **)((long)cVar6.
                                        super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                                        ._M_cur + 0x50),(allocator *)&local_178);
            local_138 = &local_128;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
            msg._M_dataplus._M_p._0_4_ = 0x143;
            msg._M_string_length = (size_type)psVar1;
            if (local_b8 != &local_a8) {
              msg._M_string_length = (size_type)local_b8;
            }
            msg.field_2._M_allocated_capacity = local_b0;
            local_b0 = 0;
            local_a8 = 0;
            local_130 = 0;
            local_128 = 0;
            local_138 = &local_128;
            local_b8 = &local_a8;
            iVar7 = std::__cxx11::
                    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                    ::emplace<Diligent::Parsing::HLSLTokenInfo>
                              (this_01,iVar7._M_node,(HLSLTokenInfo *)&msg);
            Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
            if (local_138 != &local_128) {
              operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
            }
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
            }
            std::__cxx11::string::push_back((char)iVar7._M_node + '\x18');
            return true;
          }
          return true;
        }
        FormatString<char[34],std::__cxx11::string,char[2],std::__cxx11::string,char[2],unsigned_int,char[27],std::__cxx11::string>
                  (&msg,(Diligent *)"Unable to find function stub for ",
                   (char (*) [34])&Pos._M_node[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x363ffe,
                   (char (*) [2])&p_Var2[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x32e2ea,
                   (char (*) [2])&NumArguments,(uint *)" args). GLSL object type: ",
                   (char (*) [27])_Obj,Args_7);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethod(TokenListType::iterator&       Token,
                                                                   const TokenListType::iterator& ScopeStart,
                                                                   const TokenListType::iterator& ScopeEnd)
{
    // TestText.Sample( ...
    //         ^
    //      DotToken
    auto DotToken = Token;
    VERIFY_EXPR(DotToken != ScopeEnd && Token->Literal == ".");
    auto MethodToken = DotToken;
    ++MethodToken;
    VERIFY_EXPR(MethodToken != ScopeEnd && MethodToken->Type == TokenType::Identifier);
    // TestText.Sample( ...
    //          ^
    //     MethodToken
    auto IdentifierToken = DotToken;
    // m_Tokens contains dummy node at the beginning, so we can
    // check for ScopeStart to break the loop
    while (IdentifierToken != ScopeStart && IdentifierToken->Type != TokenType::Identifier)
    {
        --IdentifierToken;
        if (IdentifierToken->Type == TokenType::ClosingAngleBracket ||
            IdentifierToken->Type == TokenType::ClosingSquareBracket ||
            IdentifierToken->Type == TokenType::ClosingParen)
        {
            // TestText[idx[0]].Sample( ...
            //                ^
            IdentifierToken = Parsing::FindMatchingBracket(ScopeStart, ScopeEnd, IdentifierToken);
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching open square bracket.");
            // TestText[idx[0]].Sample( ...
            //         ^
        }
    }
    if (IdentifierToken == ScopeStart)
        return false;
    // TestTextArr[2].Sample( ...
    // ^
    // IdentifierToken

    // Try to find identifier
    const auto* pObjectInfo = FindHLSLObject(IdentifierToken->Literal);
    if (pObjectInfo == nullptr)
    {
        return false;
    }
    const auto& ObjectType = pObjectInfo->GLSLType;

    auto ArgsListStartToken = MethodToken;
    ++ArgsListStartToken;

    // TestText.Sample( ...
    //                ^
    //     ArgsListStartToken

    if (ArgsListStartToken == ScopeEnd || ArgsListStartToken->Type != TokenType::OpenParen)
        return false;
    auto   ArgsListEndToken = ArgsListStartToken;
    Uint32 NumArguments     = CountFunctionArguments(ArgsListEndToken, ScopeEnd);

    if (ArgsListEndToken == ScopeEnd)
        return false;
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                       ^
    //                                               ArgsListEndToken
    auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey(ObjectType, MethodToken->Literal.c_str(), NumArguments));
    if (StubIt == m_Converter.m_GLSLStubs.end())
    {
        LOG_ERROR_MESSAGE("Unable to find function stub for ", IdentifierToken->Literal, ".", MethodToken->Literal, "(", NumArguments, " args). GLSL object type: ", ObjectType);
        return false;
    }

    //            DotToken
    //               V
    // TestTextArr[2].Sample( TestTextArr_sampler, ...
    // ^                    ^
    // IdentifierToken      ArgsListStartToken

    *ArgsListStartToken = TokenInfo(TokenType::Comma, ",");
    // TestTextArr[2].Sample, TestTextArr_sampler, ...
    //               ^      ^
    //           DotToken  ArgsListStartToken

    m_Tokens.erase(DotToken, ArgsListStartToken);
    // TestTextArr[2], TestTextArr_sampler, ...
    // ^
    // IdentifierToken

    m_Tokens.insert(IdentifierToken, TokenInfo(TokenType::Identifier, StubIt->second.Name.c_str(), IdentifierToken->Delimiter.c_str()));
    IdentifierToken->Delimiter = " ";
    // FunctionStub TestTextArr[2], TestTextArr_sampler, ...
    //              ^
    //              IdentifierToken


    m_Tokens.insert(IdentifierToken, TokenInfo(TokenType::OpenParen, "("));
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...
    //               ^
    //               IdentifierToken

    Token = ArgsListStartToken;
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...
    //                             ^
    //                           Token

    // Nested function calls will be automatically processed:
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, TestTex.Sample(...
    //                             ^
    //                           Token


    // Add swizzling if there is any
    if (StubIt->second.Swizzle.length() > 0)
    {
        // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...    );
        //                                                            ^
        //                                                     ArgsListEndToken

        auto SwizzleToken = m_Tokens.insert(ArgsListEndToken, TokenInfo(TokenType::TextBlock, StubIt->second.Swizzle.c_str(), ""));
        SwizzleToken->Literal.push_back(static_cast<Char>('0' + pObjectInfo->NumComponents));
        // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...    )_SWIZZLE4;
        //                                                                     ^
        //                                                            ArgsListEndToken
    }
    return true;
}